

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

void ReadFillInMissingBoxes(ON_Brep *brep)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ON_BrepLoop *pOVar4;
  int *piVar5;
  ON_BrepTrim *pOVar6;
  ON_BrepLoop *loop;
  ON_BrepTrim *local_38;
  ON_BrepTrim *trim;
  ON_Curve *c2;
  int local_20;
  int loop_count;
  int trim_count;
  int lti;
  int li;
  int ti;
  ON_Brep *brep_local;
  
  _li = brep;
  local_20 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&brep->m_T);
  c2._4_4_ = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&_li->m_L);
  for (lti = 0; lti < local_20; lti = lti + 1) {
    local_38 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&_li->m_T,lti);
    bVar2 = ON_BoundingBox::IsValid(&local_38->m_pbox);
    if ((!bVar2) &&
       (trim = (ON_BrepTrim *)ON_BrepTrim::TrimCurveOf(local_38), trim != (ON_BrepTrim *)0x0)) {
      ON_Geometry::BoundingBox((ON_BoundingBox *)&loop,(ON_Geometry *)trim);
      memcpy(&local_38->m_pbox,&loop,0x30);
    }
  }
  for (trim_count = 0; trim_count < c2._4_4_; trim_count = trim_count + 1) {
    pOVar4 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&_li->m_L,trim_count);
    bVar2 = ON_BoundingBox::IsValid(&pOVar4->m_pbox);
    if (!bVar2) {
      for (loop_count = 0; iVar1 = loop_count, iVar3 = ON_SimpleArray<int>::Count(&pOVar4->m_ti),
          iVar1 < iVar3; loop_count = loop_count + 1) {
        piVar5 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,loop_count);
        lti = *piVar5;
        if ((-1 < lti) && (lti < local_20)) {
          pOVar6 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&_li->m_T,lti);
          ON_BoundingBox::Union(&pOVar4->m_pbox,&pOVar6->m_pbox);
        }
      }
    }
  }
  return;
}

Assistant:

static
void ReadFillInMissingBoxes( ON_Brep& brep )
{
  // older files did not save bounding box information
  int ti, li, lti, trim_count, loop_count;
  const ON_Curve* c2;
  trim_count = brep.m_T.Count();
  loop_count = brep.m_L.Count();
  for ( ti = 0; ti < trim_count; ti++ )
  {
    ON_BrepTrim& trim = brep.m_T[ti];
    if ( !trim.m_pbox.IsValid() ) 
    {
      c2 = trim.TrimCurveOf();
      if ( c2 )
        trim.m_pbox = c2->BoundingBox();
    }
  }

  for ( li = 0; li < loop_count; li++ )
  {
    ON_BrepLoop& loop = brep.m_L[li];
    if ( !loop.m_pbox.IsValid() ) 
    {
      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        ti = loop.m_ti[lti];
        if ( ti >= 0 && ti < trim_count )
          loop.m_pbox.Union( brep.m_T[ti].m_pbox );
      }
    }
  }
}